

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaProcessXSIType
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaAttrInfoPtr iattr,xmlSchemaTypePtr *localType,
              xmlSchemaElementPtr elemDecl)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *name;
  uint set;
  char *in_R8;
  int in_R9D;
  long lVar5;
  xmlChar *str;
  xmlChar *local_40;
  xmlSchemaElementPtr local_38;
  
  if (localType == (xmlSchemaTypePtr *)0x0) {
    return -1;
  }
  *localType = (xmlSchemaTypePtr)0x0;
  vctxt->inode = (xmlSchemaNodeInfoPtr)iattr;
  pxVar3 = iattr->value;
  local_38 = elemDecl;
  iVar1 = xmlValidateQName(pxVar3,1);
  if (iVar1 == -1) {
    iVar1 = -1;
LAB_001ce9dd:
    pxVar4 = (xmlChar *)0x0;
    name = (xmlChar *)0x0;
  }
  else {
    if (0 < iVar1) {
      in_R8 = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
      xmlSchemaSimpleTypeErr
                ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,
                 (xmlNodePtr)0x0,pxVar3,(xmlSchemaTypePtr)in_R8,in_R9D);
      iVar1 = 1;
      goto LAB_001ce9dd;
    }
    pxVar4 = xmlSplitQName2(pxVar3,&local_40);
    if (pxVar4 == (xmlChar *)0x0) {
      name = xmlDictLookup(vctxt->dict,pxVar3,-1);
    }
    else {
      name = xmlDictLookup(vctxt->dict,pxVar4,-1);
      (*xmlFree)(pxVar4);
    }
    pxVar4 = xmlSchemaLookupNamespace(vctxt,local_40);
    iVar1 = 0;
    if ((local_40 != (xmlChar *)0x0) && ((*xmlFree)(local_40), pxVar4 == (xmlChar *)0x0)) {
      pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
      in_R8 = "The QName value \'%s\' has no corresponding namespace declaration in scope";
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,
                          (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar2,
                          "The QName value \'%s\' has no corresponding namespace declaration in scope"
                          ,pxVar3,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar1 = 2;
    }
  }
  if (iVar1 == 0) {
    pxVar2 = xmlSchemaGetType(vctxt->schema,name,pxVar4);
    *localType = pxVar2;
    if (pxVar2 != (xmlSchemaTypePtr)0x0) {
      if (local_38 == (xmlSchemaElementPtr)0x0) {
        lVar5 = 0;
      }
      else {
        if ((((uint)local_38->flags >> 0xb & 1) != 0) ||
           (set = 0, (local_38->subtypes->flags & 0x40000) != 0)) {
          set = 2;
        }
        if ((((uint)local_38->flags >> 0xc & 1) != 0) ||
           ((local_38->subtypes->flags & 0x80000) != 0)) {
          set = set | 1;
        }
        iVar1 = xmlSchemaCheckCOSDerivedOK
                          ((xmlSchemaAbstractCtxtPtr)vctxt,pxVar2,local_38->subtypes,set);
        lVar5 = 0;
        if (iVar1 != 0) {
          lVar5 = 0;
          local_40 = (xmlChar *)0x0;
          pxVar3 = xmlSchemaFormatQName(&local_40,(*localType)->targetNamespace,(*localType)->name);
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_4_3,
                              (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                              "The type definition \'%s\', specified by xsi:type, is blocked or not validly derived from the type definition of the element declaration"
                              ,pxVar3,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          if (local_40 != (xmlChar *)0x0) {
            (*xmlFree)(local_40);
            local_40 = (xmlChar *)0x0;
          }
          *localType = (xmlSchemaTypePtr)0x0;
        }
      }
      goto LAB_001ce9f0;
    }
    local_40 = (xmlChar *)0x0;
    pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
    pxVar3 = xmlSchemaFormatQName(&local_40,pxVar4,name);
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_4_2,(xmlNodePtr)0x0,
                        (xmlSchemaBasicItemPtr)pxVar2,
                        "The QName value \'%s\' of the xsi:type attribute does not resolve to a type definition"
                        ,pxVar3,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    if (local_40 != (xmlChar *)0x0) {
      (*xmlFree)(local_40);
    }
    iVar1 = vctxt->err;
  }
  else {
    lVar5 = 3;
    if (-1 < iVar1) {
LAB_001ce9f0:
      iVar1 = (*(code *)((long)&DAT_00204a30 + (long)(int)(&DAT_00204a30)[lVar5]))();
      return iVar1;
    }
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElementByDeclaration",
               "calling xmlSchemaQNameExpand() to validate the attribute \'xsi:type\'",
               (xmlChar *)0x0,(xmlChar *)in_R8);
    iVar1 = -1;
  }
  vctxt->inode = vctxt->elemInfos[vctxt->depth];
  return iVar1;
}

Assistant:

static int
xmlSchemaProcessXSIType(xmlSchemaValidCtxtPtr vctxt,
			xmlSchemaAttrInfoPtr iattr,
			xmlSchemaTypePtr *localType,
			xmlSchemaElementPtr elemDecl)
{
    int ret = 0;
    /*
    * cvc-elt (3.3.4) : (4)
    * AND
    * Schema-Validity Assessment (Element) (cvc-assess-elt)
    *   (1.2.1.2.1) - (1.2.1.2.4)
    * Handle 'xsi:type'.
    */
    if (localType == NULL)
	return (-1);
    *localType = NULL;
    if (iattr == NULL)
	return (0);
    else {
	const xmlChar *nsName = NULL, *local = NULL;
	/*
	* TODO: We should report a *warning* that the type was overridden
	* by the instance.
	*/
	ACTIVATE_ATTRIBUTE(iattr);
	/*
	* (cvc-elt) (3.3.4) : (4.1)
	* (cvc-assess-elt) (1.2.1.2.2)
	*/
	ret = xmlSchemaVExpandQName(vctxt, iattr->value,
	    &nsName, &local);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElementByDeclaration",
		    "calling xmlSchemaQNameExpand() to validate the "
		    "attribute 'xsi:type'");
		goto internal_error;
	    }
	    goto exit;
	}
	/*
	* (cvc-elt) (3.3.4) : (4.2)
	* (cvc-assess-elt) (1.2.1.2.3)
	*/
	*localType = xmlSchemaGetType(vctxt->schema, local, nsName);
	if (*localType == NULL) {
	    xmlChar *str = NULL;

	    xmlSchemaCustomErr(ACTXT_CAST vctxt,
		XML_SCHEMAV_CVC_ELT_4_2, NULL,
		WXS_BASIC_CAST xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME),
		"The QName value '%s' of the xsi:type attribute does not "
		"resolve to a type definition",
		xmlSchemaFormatQName(&str, nsName, local), NULL);
	    FREE_AND_NULL(str);
	    ret = vctxt->err;
	    goto exit;
	}
	if (elemDecl != NULL) {
	    int set = 0;

	    /*
	    * SPEC cvc-elt (3.3.4) : (4.3) (Type Derivation OK)
	    * "The `local type definition` must be validly
	    * derived from the {type definition} given the union of
	    * the {disallowed substitutions} and the {type definition}'s
	    * {prohibited substitutions}, as defined in
	    * Type Derivation OK (Complex) ($3.4.6)
	    * (if it is a complex type definition),
	    * or given {disallowed substitutions} as defined in Type
	    * Derivation OK (Simple) ($3.14.6) (if it is a simple type
	    * definition)."
	    *
	    * {disallowed substitutions}: the "block" on the element decl.
	    * {prohibited substitutions}: the "block" on the type def.
	    */
	    /*
	    * OPTIMIZE TODO: We could map types already evaluated
	    * to be validly derived from other types to avoid checking
	    * this over and over for the same types.
	    */
	    if ((elemDecl->flags & XML_SCHEMAS_ELEM_BLOCK_EXTENSION) ||
		(elemDecl->subtypes->flags &
		    XML_SCHEMAS_TYPE_BLOCK_EXTENSION))
		set |= SUBSET_EXTENSION;

	    if ((elemDecl->flags & XML_SCHEMAS_ELEM_BLOCK_RESTRICTION) ||
		(elemDecl->subtypes->flags &
		    XML_SCHEMAS_TYPE_BLOCK_RESTRICTION))
		set |= SUBSET_RESTRICTION;

	    /*
	    * REMOVED and CHANGED since this produced a parser context
	    * which adds to the string dict of the schema. So this would
	    * change the schema and we don't want this. We don't need
	    * the parser context anymore.
	    *
	    * if ((vctxt->pctxt == NULL) &&
	    *	(xmlSchemaCreatePCtxtOnVCtxt(vctxt) == -1))
	    *	    return (-1);
	    */

	    if (xmlSchemaCheckCOSDerivedOK(ACTXT_CAST vctxt, *localType,
		elemDecl->subtypes, set) != 0) {
		xmlChar *str = NULL;

		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_ELT_4_3, NULL, NULL,
		    "The type definition '%s', specified by xsi:type, is "
		    "blocked or not validly derived from the type definition "
		    "of the element declaration",
		    xmlSchemaFormatQName(&str,
			(*localType)->targetNamespace,
			(*localType)->name),
		    NULL);
		FREE_AND_NULL(str);
		ret = vctxt->err;
		*localType = NULL;
	    }
	}
    }
exit:
    ACTIVATE_ELEM;
    return (ret);
internal_error:
    ACTIVATE_ELEM;
    return (-1);
}